

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat0.c
# Opt level: O1

ggml_tensor * get_random_tensor(ggml_context *ctx0,int ndims,int64_t *ne,float fmin,float fmax)

{
  undefined1 auVar1 [16];
  int iVar2;
  ggml_tensor *pgVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  pgVar3 = (ggml_tensor *)ggml_new_tensor(ctx0,0,ndims,ne);
  switch(ndims) {
  case 1:
    if (0 < *ne) {
      lVar7 = 0;
      do {
        iVar2 = rand();
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)((float)iVar2 * 4.656613e-10)),
                                 ZEXT416((uint)(fmax - fmin)),ZEXT416((uint)fmin));
        *(int *)((long)pgVar3->data + lVar7 * 4) = auVar1._0_4_;
        lVar7 = lVar7 + 1;
      } while (lVar7 < *ne);
    }
    break;
  case 2:
    if (0 < ne[1]) {
      lVar5 = 0;
      lVar7 = 0;
      do {
        if (0 < *ne) {
          lVar6 = 0;
          do {
            iVar2 = rand();
            lVar4 = *ne;
            auVar1 = vfmadd213ss_fma(ZEXT416((uint)((float)iVar2 * 4.656613e-10)),
                                     ZEXT416((uint)(fmax - fmin)),ZEXT416((uint)fmin));
            *(int *)((long)pgVar3->data + lVar6 * 4 + lVar5 * lVar4) = auVar1._0_4_;
            lVar6 = lVar6 + 1;
          } while (lVar6 < lVar4);
        }
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + 4;
      } while (lVar7 < ne[1]);
    }
    break;
  case 3:
    if (0 < ne[2]) {
      lVar7 = 0;
      do {
        if (0 < ne[1]) {
          lVar5 = 0;
          do {
            if (0 < *ne) {
              lVar6 = 0;
              do {
                iVar2 = rand();
                auVar1 = vfmadd213ss_fma(ZEXT416((uint)((float)iVar2 * 4.656613e-10)),
                                         ZEXT416((uint)(fmax - fmin)),ZEXT416((uint)fmin));
                *(int *)((long)pgVar3->data + lVar6 * 4 + (ne[1] * lVar7 + lVar5) * *ne * 4) =
                     auVar1._0_4_;
                lVar6 = lVar6 + 1;
              } while (lVar6 < *ne);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < ne[1]);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < ne[2]);
    }
    break;
  case 4:
    if (0 < ne[3]) {
      lVar7 = 0;
      do {
        if (0 < ne[2]) {
          lVar5 = 0;
          do {
            if (0 < ne[1]) {
              lVar6 = 0;
              do {
                if (0 < *ne) {
                  lVar4 = 0;
                  do {
                    iVar2 = rand();
                    auVar1 = vfmadd213ss_fma(ZEXT416((uint)((float)iVar2 * 4.656613e-10)),
                                             ZEXT416((uint)(fmax - fmin)),ZEXT416((uint)fmin));
                    *(int *)((long)pgVar3->data +
                            lVar4 * 4 + ((ne[2] * lVar7 + lVar5) * ne[1] + lVar6) * *ne * 4) =
                         auVar1._0_4_;
                    lVar4 = lVar4 + 1;
                  } while (lVar4 < *ne);
                }
                lVar6 = lVar6 + 1;
              } while (lVar6 < ne[1]);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < ne[2]);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < ne[3]);
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                  ,0x4b,
                  "struct ggml_tensor *get_random_tensor(struct ggml_context *, int, int64_t *, float, float)"
                 );
  }
  return pgVar3;
}

Assistant:

struct ggml_tensor * get_random_tensor(
        struct ggml_context * ctx0,
        int ndims,
        int64_t ne[],
        float fmin,
        float fmax) {
    struct ggml_tensor * result = ggml_new_tensor(ctx0, GGML_TYPE_F32, ndims, ne);

    switch (ndims) {
        case 1:
            for (int i0 = 0; i0 < ne[0]; i0++) {
                ((float *)result->data)[i0] = frand()*(fmax - fmin) + fmin;
            }
            break;
        case 2:
            for (int i1 = 0; i1 < ne[1]; i1++) {
                for (int i0 = 0; i0 < ne[0]; i0++) {
                    ((float *)result->data)[i1*ne[0] + i0] = frand()*(fmax - fmin) + fmin;
                }
            }
            break;
        case 3:
            for (int i2 = 0; i2 < ne[2]; i2++) {
                for (int i1 = 0; i1 < ne[1]; i1++) {
                    for (int i0 = 0; i0 < ne[0]; i0++) {
                        ((float *)result->data)[i2*ne[1]*ne[0] + i1*ne[0] + i0] = frand()*(fmax - fmin) + fmin;
                    }
                }
            }
            break;
        case 4:
            for (int i3 = 0; i3 < ne[3]; i3++) {
                for (int i2 = 0; i2 < ne[2]; i2++) {
                    for (int i1 = 0; i1 < ne[1]; i1++) {
                        for (int i0 = 0; i0 < ne[0]; i0++) {
                            ((float *)result->data)[i3*ne[2]*ne[1]*ne[0] + i2*ne[1]*ne[0] + i1*ne[0] + i0] = frand()*(fmax - fmin) + fmin;
                        }
                    }
                }
            }
            break;
        default:
            assert(false);
    };

    return result;
}